

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O2

void shm::gen_key(shm_key_t *key,int proj_id)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  shm_key_t val_key;
  
  if (gen_key(char&[],int)::rd == '\0') {
    iVar2 = __cxa_guard_acquire(&gen_key(char&[],int)::rd,CONCAT44(in_register_00000034,proj_id));
    if (iVar2 != 0) {
      std::random_device::random_device(&gen_key::rd);
      __cxa_atexit(std::random_device::~random_device,&gen_key::rd,&__dso_handle);
      __cxa_guard_release(&gen_key(char&[],int)::rd);
    }
  }
  if (gen_key(char&[],int)::gen == '\0') {
    iVar2 = __cxa_guard_acquire(&gen_key(char&[],int)::gen);
    if (iVar2 != 0) {
      uVar1 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&gen_key::gen,(ulong)uVar1);
      __cxa_guard_release(&gen_key(char&[],int)::gen);
    }
  }
  if (gen_key(char&[],int)::distrib == '\0') {
    iVar2 = __cxa_guard_acquire(&gen_key(char&[],int)::distrib);
    if (iVar2 != 0) {
      gen_key::distrib._M_param._M_a = 0;
      gen_key::distrib._M_param._M_b = 0x7fffffff;
      __cxa_guard_release(&gen_key(char&[],int)::distrib);
    }
  }
  uVar1 = std::uniform_int_distribution<int>::operator()(&gen_key::distrib,&gen_key::gen);
  val_key[0] = '\0';
  val_key[1] = '\0';
  val_key[2] = '\0';
  val_key[3] = '\0';
  val_key[4] = '\0';
  val_key[5] = '\0';
  val_key[6] = '\0';
  val_key[7] = '\0';
  val_key[8] = '\0';
  val_key[9] = '\0';
  val_key[10] = '\0';
  val_key[0xb] = '\0';
  val_key[0xc] = '\0';
  val_key[0xd] = '\0';
  val_key[0xe] = '\0';
  val_key[0xf] = '\0';
  val_key[0x10] = '\0';
  val_key[0x11] = '\0';
  val_key[0x12] = '\0';
  val_key[0x13] = '\0';
  val_key[0x14] = '\0';
  val_key[0x15] = '\0';
  val_key[0x16] = '\0';
  val_key[0x17] = '\0';
  snprintf(val_key,0x18,"%d",(ulong)uVar1);
  key_copy(key,val_key);
  return;
}

Assistant:

void 
shm::gen_key( shm_key_t &key, const int proj_id )
{
#if _USE_POSIX_SHM_ == 1
    //string key
    UNUSED( proj_id );
    static std::random_device rd;
    static std::mt19937 gen( rd() );
    static std::uniform_int_distribution<> distrib( 0, std::numeric_limits< int >::max() );
    const auto val = distrib( gen );
    shm_key_t val_key;
    std::memset(    val_key, 
                    '\0', 
                    shm_key_length );

    std::snprintf( val_key, 
                   shm_key_length,
                   "%d",
                   val );

    shm::key_copy( key, val_key );
    return;
#elif _USE_SYSTEMV_SHM_ == 1
    //integer key
    char *path = getcwd( nullptr, 0 );
    if( path == nullptr )
    {
        std::perror( "failed to get cwd, switching to guns, a.k.a. root dir (/)" );
        key = ftok( "/", proj_id);
    }
    else
    {
        key = ftok( path, proj_id);
    }
    return;
#endif
}